

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenCallSetTarget(BinaryenExpressionRef expr,char *target)

{
  Name local_28;
  
  if (expr->_id != CallId) {
    __assert_fail("expression->is<Call>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x8b7,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
  }
  if (target != (char *)0x0) {
    wasm::Name::Name(&local_28,target);
    *(size_t *)(expr + 3) = local_28.super_IString.str._M_len;
    expr[3].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x8b8,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallSetTarget(BinaryenExpressionRef expr, const char* target) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Call>());
  assert(target);
  static_cast<Call*>(expression)->target = target;
}